

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O1

UBool ucnv_outputOverflowToUnicode
                (UConverter *cnv,UChar **target,UChar *targetLimit,int32_t **pOffsets,
                UErrorCode *err)

{
  UChar *pUVar1;
  int32_t *piVar2;
  long lVar3;
  UChar *pUVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (pOffsets == (int32_t **)0x0) {
    piVar2 = (int32_t *)0x0;
  }
  else {
    piVar2 = *pOffsets;
  }
  pUVar4 = *target;
  uVar5 = (ulong)cnv->UCharErrorBufferLength;
  if (0 < (long)uVar5) {
    uVar6 = 0;
    do {
      if (pUVar4 == targetLimit) {
        lVar3 = 0;
        do {
          pUVar1 = cnv->UCharErrorBuffer + uVar6;
          uVar6 = uVar6 + 1;
          cnv->UCharErrorBuffer[lVar3] = *pUVar1;
          lVar3 = lVar3 + 1;
        } while (uVar6 < uVar5);
        cnv->UCharErrorBufferLength = (int8_t)lVar3;
        *target = pUVar4;
        if (piVar2 != (int32_t *)0x0) {
          *pOffsets = piVar2;
        }
        *err = U_BUFFER_OVERFLOW_ERROR;
        return '\x01';
      }
      *pUVar4 = cnv->UCharErrorBuffer[uVar6];
      if (piVar2 == (int32_t *)0x0) {
        piVar2 = (int32_t *)0x0;
      }
      else {
        *piVar2 = -1;
        piVar2 = piVar2 + 1;
      }
      uVar6 = uVar6 + 1;
      pUVar4 = pUVar4 + 1;
    } while (uVar5 != uVar6);
  }
  cnv->UCharErrorBufferLength = '\0';
  *target = pUVar4;
  if (piVar2 != (int32_t *)0x0) {
    *pOffsets = piVar2;
  }
  return '\0';
}

Assistant:

static UBool
ucnv_outputOverflowToUnicode(UConverter *cnv,
                             UChar **target, const UChar *targetLimit,
                             int32_t **pOffsets,
                             UErrorCode *err) {
    int32_t *offsets;
    UChar *overflow, *t;
    int32_t i, length;

    t=*target;
    if(pOffsets!=NULL) {
        offsets=*pOffsets;
    } else {
        offsets=NULL;
    }

    overflow=cnv->UCharErrorBuffer;
    length=cnv->UCharErrorBufferLength;
    i=0;
    while(i<length) {
        if(t==targetLimit) {
            /* the overflow buffer contains too much, keep the rest */
            int32_t j=0;

            do {
                overflow[j++]=overflow[i++];
            } while(i<length);

            cnv->UCharErrorBufferLength=(int8_t)j;
            *target=t;
            if(offsets!=NULL) {
                *pOffsets=offsets;
            }
            *err=U_BUFFER_OVERFLOW_ERROR;
            return TRUE;
        }

        /* copy the overflow contents to the target */
        *t++=overflow[i++];
        if(offsets!=NULL) {
            *offsets++=-1; /* no source index available for old output */
        }
    }

    /* the overflow buffer is completely copied to the target */
    cnv->UCharErrorBufferLength=0;
    *target=t;
    if(offsets!=NULL) {
        *pOffsets=offsets;
    }
    return FALSE;
}